

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall nnad::Matrix<double>::SetElement(Matrix<double> *this,int *i,int *j,double *value)

{
  value_type vVar1;
  reference pvVar2;
  value_type *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  allocator<char> local_79;
  string local_78 [8];
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_41;
  string local_40 [32];
  value_type *local_20;
  int *local_18;
  int *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*in_RSI < 0) || (*in_RDI < *in_RSI)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    Error((string *)0x1108f9);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if ((*local_18 < 0) || (in_RDI[1] < *local_18)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    Error((string *)0x11099a);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  vVar1 = *local_20;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),
                      (long)(*local_10 * in_RDI[1] + *local_18));
  *pvVar2 = vVar1;
  return;
}

Assistant:

void SetElement(int const& i, int const& j, T const& value)
    {
      if (i < 0 || i > _Lines)
        Error("SetElement: line index out of range.");

      if (j < 0 || j > _Columns)
        Error("SetElement: column index out of range.");

      _Matrix[i * _Columns + j] = value;
    }